

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O3

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::CloneSet
          (SerializationCloner<Js::StreamWriter> *this,Src src,Dst dst)

{
  bool bVar1;
  JavascriptSet *this_00;
  Engine *this_01;
  uint local_34;
  undefined1 local_30 [4];
  uint unused;
  Iterator iter;
  
  this_00 = VarTo<Js::JavascriptSet>(src);
  local_30 = (undefined1  [4])JavascriptSet::Size(this_00);
  StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)local_30);
  JavascriptSet::GetIterator((JavascriptSet *)local_30);
  bVar1 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)local_30);
  if (bVar1) {
    do {
      this_01 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                ::GetEngine(&this->
                             super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                           );
      SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                (this_01,iter.list.ptr[1].first.ptr,&local_34);
      bVar1 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)local_30);
    } while (bVar1);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::CloneSet(Src src, Dst dst)
    {
        JavascriptSet* set = VarTo<JavascriptSet>(src);

        Write((int32)(set->Size()));

        JavascriptSet::SetDataList::Iterator iter = set->GetIterator();
        while (iter.Next())
        {
            this->GetEngine()->Clone(iter.Current());
        }
    }